

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::TraceSettings(GlobOpt *this)

{
  Loop *this_00;
  bool bVar1;
  ImplicitCallFlags flags;
  uint uVar2;
  char16 *pcVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  
  Output::Print(L"GlobOpt Settings:\r\n");
  pcVar5 = L"enabled";
  pcVar4 = L"enabled";
  if ((*(uint *)&this->field_0xf4 >> 0xd & 1) == 0) {
    pcVar4 = L"disabled";
  }
  Output::Print(L"    FloatTypeSpec: %s\r\n",pcVar4);
  pcVar4 = L"enabled";
  if ((*(uint *)&this->field_0xf4 >> 9 & 1) == 0) {
    pcVar4 = L"disabled";
  }
  Output::Print(L"    AggressiveIntTypeSpec: %s\r\n",pcVar4);
  pcVar4 = L"enabled";
  if ((*(uint *)&this->field_0xf4 >> 0xc & 1) == 0) {
    pcVar4 = L"disabled";
  }
  Output::Print(L"    LossyIntTypeSpec: %s\r\n",pcVar4);
  bVar1 = Func::IsArrayCheckHoistDisabled(this->func);
  if (bVar1) {
    pcVar5 = L"disabled";
  }
  Output::Print(L"    ArrayCheckHoist: %s\r\n",pcVar5);
  pcVar3 = Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->func->m_fg->implicitCallFlags);
  Output::Print(L"    ImplicitCallFlags: %s\r\n",pcVar3);
  for (this_00 = this->func->m_fg->loopList; this_00 != (Loop *)0x0; this_00 = this_00->next) {
    uVar2 = Loop::GetLoopNumber(this_00);
    flags = Loop::GetImplicitCallFlags(this_00);
    pcVar3 = Js::DynamicProfileInfo::GetImplicitCallFlagsString(flags);
    Output::Print(L"        loop: %d, ImplicitCallFlags: %s\r\n",(ulong)uVar2,pcVar3);
  }
  Output::Flush();
  return;
}

Assistant:

void
GlobOpt::TraceSettings() const
{
    Output::Print(_u("GlobOpt Settings:\r\n"));
    Output::Print(_u("    FloatTypeSpec: %s\r\n"), this->DoFloatTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    AggressiveIntTypeSpec: %s\r\n"), this->DoAggressiveIntTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    LossyIntTypeSpec: %s\r\n"), this->DoLossyIntTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    ArrayCheckHoist: %s\r\n"),  this->func->IsArrayCheckHoistDisabled() ? _u("disabled") : _u("enabled"));
    Output::Print(_u("    ImplicitCallFlags: %s\r\n"), Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->func->m_fg->implicitCallFlags));
    for (Loop * loop = this->func->m_fg->loopList; loop != NULL; loop = loop->next)
    {
        Output::Print(_u("        loop: %d, ImplicitCallFlags: %s\r\n"), loop->GetLoopNumber(),
            Js::DynamicProfileInfo::GetImplicitCallFlagsString(loop->GetImplicitCallFlags()));
    }

    Output::Flush();
}